

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Rectangle GetImageAlphaBorder(Image image,float threshold)

{
  Image image_00;
  Color *__ptr;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Rectangle RVar13;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  
  image_00.width = in_stack_ffffffffffffffd8;
  image_00.data = (void *)in_stack_ffffffffffffffd0;
  image_00.height = in_stack_ffffffffffffffdc;
  image_00._16_8_ = in_stack_ffffffffffffffe0;
  __ptr = LoadImageColors(image_00);
  if (__ptr == (Color *)0x0) {
    fVar9 = 0.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
  }
  else {
    if ((long)image.height < 1) {
      iVar1 = 0;
      iVar2 = 0x10000;
      iVar4 = 0;
      iVar3 = 0x10000;
    }
    else {
      puVar5 = &__ptr->a;
      lVar7 = 0;
      iVar3 = 0x10000;
      iVar4 = 0;
      iVar1 = 0;
      iVar2 = 0x10000;
      do {
        if (0 < image.width) {
          uVar8 = 0;
          do {
            if ((byte)(int)(threshold * 255.0) < puVar5[uVar8 * 4]) {
              iVar6 = (int)uVar8;
              if (iVar6 < iVar3) {
                iVar3 = iVar6;
              }
              if (iVar4 < iVar6) {
                iVar4 = iVar6;
              }
              iVar6 = (int)lVar7;
              if (iVar6 < iVar2) {
                iVar2 = iVar6;
              }
              if (iVar1 < iVar6) {
                iVar1 = iVar6;
              }
            }
            uVar8 = uVar8 + 1;
          } while ((uint)image.width != uVar8);
        }
        lVar7 = lVar7 + 1;
        puVar5 = puVar5 + (ulong)(uint)image.width * 4;
      } while (lVar7 != image.height);
    }
    fVar9 = 0.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    if ((iVar3 != 0x10000) && (iVar4 != 0x10000)) {
      fVar9 = (float)iVar3;
      fVar10 = (float)iVar2;
      fVar11 = (float)((iVar4 - iVar3) + 1);
      fVar12 = (float)((iVar1 - iVar2) + 1);
    }
    free(__ptr);
  }
  RVar13.y = fVar10;
  RVar13.x = fVar9;
  RVar13.height = fVar12;
  RVar13.width = fVar11;
  return RVar13;
}

Assistant:

Rectangle GetImageAlphaBorder(Image image, float threshold)
{
    Rectangle crop = { 0 };

    Color *pixels = LoadImageColors(image);

    if (pixels != NULL)
    {
        int xMin = 65536;   // Define a big enough number
        int xMax = 0;
        int yMin = 65536;
        int yMax = 0;

        for (int y = 0; y < image.height; y++)
        {
            for (int x = 0; x < image.width; x++)
            {
                if (pixels[y*image.width + x].a > (unsigned char)(threshold*255.0f))
                {
                    if (x < xMin) xMin = x;
                    if (x > xMax) xMax = x;
                    if (y < yMin) yMin = y;
                    if (y > yMax) yMax = y;
                }
            }
        }

        // Check for empty blank image
        if ((xMin != 65536) && (xMax != 65536))
        {
            crop = (Rectangle){ (float)xMin, (float)yMin, (float)((xMax + 1) - xMin), (float)((yMax + 1) - yMin) };
        }

        UnloadImageColors(pixels);
    }

    return crop;
}